

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  pointer plVar5;
  byte bVar6;
  bool bVar7;
  undefined8 uVar8;
  int *piVar9;
  Diagnostic *this_00;
  byte *pbVar10;
  char *pcVar11;
  TokenKind TVar12;
  uint uVar13;
  size_type sVar14;
  ulong uVar15;
  LiteralBase base;
  long lVar16;
  ulong in_R9;
  size_type sVar17;
  double dVar18;
  undefined1 auVar19 [16];
  Token TVar20;
  char c;
  SVInt intVal;
  optional<slang::TimeUnit> timeSuffix;
  bool outOfRange;
  double value;
  SmallVector<char,_40UL> floatChars;
  SmallVector<slang::logic_t,_40UL> digits;
  byte local_f9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f8;
  uint local_f0;
  ushort local_ec;
  _Storage<slang::TimeUnit,_true> local_e4 [3];
  bool local_e1;
  undefined8 local_e0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d8;
  uint local_d0;
  byte local_cb;
  SmallVectorBase<char> local_c8 [2];
  long local_88;
  SmallVectorBase<slang::logic_t> local_80 [2];
  char *local_40;
  size_type sStack_38;
  undefined6 extraout_var;
  
  pbVar10 = (byte *)this->sourceBuffer;
  bVar6 = *pbVar10;
  if (bVar6 == 0x30) {
    do {
      pbVar10 = pbVar10 + 1;
      this->sourceBuffer = (char *)pbVar10;
      bVar6 = *pbVar10;
    } while (bVar6 == 0x30);
  }
  else if (bVar6 == 0x31) {
    lVar16 = 1;
    do {
      if (lVar16 == 5) {
        this->sourceBuffer = (char *)(pbVar10 + 5);
        TVar20 = create<>(this,OneStep);
        return TVar20;
      }
      pbVar1 = pbVar10 + lVar16;
      pbVar2 = (byte *)("1step" + lVar16);
      lVar16 = lVar16 + 1;
    } while (*pbVar1 == *pbVar2);
  }
  local_88 = (long)pbVar10 - (long)this->originalBegin;
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 0x28;
  local_c8[0].data_ = local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 0x28;
  do {
    sVar17 = local_80[0].len;
    plVar5 = local_80[0].data_;
    if (bVar6 != 0x5f) {
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_00328cd4;
      local_f8.val._0_1_ = bVar6 - 0x30;
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>(local_80,(logic_t *)&local_f8);
      pbVar10 = (byte *)this->sourceBuffer;
    }
    this->sourceBuffer = (char *)(pbVar10 + 1);
    bVar6 = pbVar10[1];
    pbVar10 = pbVar10 + 1;
  } while( true );
LAB_00328dd5:
  if (!bVar7) {
    Diagnostics::add(this->diagnostics,(DiagCode)0xd0002,
                     (SourceLocation)
                     (((long)pbVar10 - (long)this->originalBegin) * 0x10000000 |
                     (ulong)((this->bufferId).id & 0xfffffff)));
    local_f8.val._0_1_ = 0x30;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    pbVar10 = (byte *)this->sourceBuffer;
  }
  goto LAB_00328e10;
LAB_00328fbf:
  if ((bool)(uVar4 != 0 | bVar7)) {
    pcVar11 = this->sourceBuffer;
    this->sourceBuffer = pcVar11 + uVar15;
    if (!bVar7) {
      Diagnostics::add(this->diagnostics,(DiagCode)0xc0002,
                       (SourceLocation)
                       ((long)(pcVar11 + (uVar15 - (long)this->originalBegin)) * 0x10000000 |
                       (ulong)((this->bufferId).id & 0xfffffff)));
      local_f8.val._0_1_ = 0x31;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    }
    TVar12 = Unknown;
    goto LAB_0032901a;
  }
  local_c8[0].len = 0;
  goto LAB_003290b3;
LAB_00328cd4:
  if (bVar6 == 0x2e) {
    this->sourceBuffer = (char *)(pbVar10 + 1);
    if (local_80[0].len == 0) {
      local_f8.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    }
    else {
      sVar14 = 0;
      do {
        local_f8.val._0_1_ = *(char *)(plVar5 + sVar14) + '0';
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
        sVar14 = sVar14 + 1;
      } while (sVar17 != sVar14);
    }
    local_f8.val._0_1_ = 0x2e;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    pbVar10 = (byte *)this->sourceBuffer;
    if (*pbVar10 == 0x5f) {
      Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                       (SourceLocation)
                       (((long)pbVar10 - (long)this->originalBegin) * 0x10000000 |
                       (ulong)((this->bufferId).id & 0xfffffff)));
      pbVar10 = (byte *)this->sourceBuffer;
    }
    bVar7 = false;
    do {
      bVar6 = *pbVar10;
      local_f8.val._0_1_ = bVar6;
      if (bVar6 != 0x5f) {
        if (9 < (byte)(bVar6 - 0x30)) goto LAB_00328dd5;
        SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f8.val);
        pbVar10 = (byte *)this->sourceBuffer;
        bVar7 = true;
      }
      pbVar10 = pbVar10 + 1;
      this->sourceBuffer = (char *)pbVar10;
    } while( true );
  }
LAB_00328e10:
  sVar17 = local_80[0].len;
  plVar5 = local_80[0].data_;
  local_e4[1]._M_value = Seconds;
  local_f9 = *pbVar10;
  if ((local_f9 & 0xdf) == 0x45) {
    local_e0 = local_c8[0].len;
    if (local_c8[0].len == 0) {
      if (local_80[0].len == 0) {
        local_f8.val._0_1_ = 0x30;
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
      }
      else {
        sVar14 = 0;
        do {
          local_f8.val._0_1_ = *(char *)(plVar5 + sVar14) + '0';
          SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
          sVar14 = sVar14 + 1;
        } while (sVar17 != sVar14);
      }
    }
    local_f8.val._0_1_ = 0x65;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    uVar4 = local_e0;
    pcVar11 = this->sourceBuffer;
    local_f9 = pcVar11[1];
    if ((local_f9 == 0x2d) || (uVar13 = 1, local_f9 == 0x2b)) {
      SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f9);
      pcVar11 = this->sourceBuffer;
      local_f9 = pcVar11[2];
      uVar13 = 2;
    }
    if ((uVar4 != 0) && (local_f9 == 0x5f)) {
      Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                       (SourceLocation)
                       (((long)pcVar11 - (long)this->originalBegin) * 0x10000000 |
                       (ulong)((this->bufferId).id & 0xfffffff)));
    }
    uVar15 = (ulong)uVar13;
    bVar7 = false;
    do {
      if (local_f9 != 0x5f) {
        if (9 < (byte)(local_f9 - 0x30)) goto LAB_00328fbf;
        bVar7 = true;
        SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f9);
      }
      local_f9 = this->sourceBuffer[uVar15 + 1];
      uVar15 = uVar15 + 1;
    } while( true );
  }
  local_e4._0_2_ = lexTimeLiteral(this);
  sVar17 = local_80[0].len;
  plVar5 = local_80[0].data_;
  uVar8 = CONCAT62(extraout_var,local_e4._0_2_);
  TVar12 = (TokenKind)((ulong)uVar8 >> 8);
  if (((uint)uVar8 >> 8 & 1) == 0) {
LAB_0032901a:
    if (local_c8[0].len == 0) {
LAB_003290b3:
      sVar17 = local_80[0].len;
      local_f8.val = 0;
      local_f0 = 1;
      local_ec = 0;
      if (local_80[0].len != 0) {
        auVar19._8_4_ = (int)(local_80[0].len >> 0x20);
        auVar19._0_8_ = local_80[0].len;
        auVar19._12_4_ = 0x45300000;
        dVar18 = ceil(((auVar19._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_80[0].len) - 4503599627370496.0)) *
                      3.321928094887362);
        if (dVar18 <= 16777215.0) {
          base = (LiteralBase)(long)dVar18;
        }
        else {
          this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0x20003,
                                     (SourceLocation)
                                     (local_88 << 0x1c | (ulong)((this->bufferId).id & 0xfffffff)));
          local_d8.val = 0xffffff;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<long>(&this_00->args,(long *)&local_d8.val);
          base = ~Binary;
          sVar17 = local_80[0].len;
        }
        local_40 = (char *)local_80[0].data_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = in_R9;
        sStack_38 = sVar17;
        SVInt::fromDigits((bitwidth_t)&local_d8,base,true,false,
                          (span<const_slang::logic_t,_18446744073709551615UL>)(auVar3 << 0x40));
        SVInt::operator=((SVInt *)&local_f8,(SVInt *)&local_d8);
        if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0)) {
          operator_delete__(local_d8.pVal);
        }
        SVInt::shrinkToFit((SVInt *)&local_f8);
      }
      TVar20 = create<slang::SVInt&>(this,IntegerLiteral,(SVInt *)&local_f8);
      if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) &&
         ((undefined1 *)local_f8.val != (undefined1 *)0x0)) {
        operator_delete__(local_f8.pVal);
      }
      goto LAB_0032920d;
    }
  }
  else if (local_c8[0].len == 0) {
    if (local_80[0].len == 0) {
      local_f8.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    }
    else {
      local_e0 = CONCAT44(local_e0._4_4_,(int)((ulong)uVar8 >> 8)) & 0xffffffff00ffffff;
      sVar14 = 0;
      do {
        local_f8.val._0_1_ = *(char *)(plVar5 + sVar14) + '0';
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
        sVar14 = sVar14 + 1;
      } while (sVar17 != sVar14);
      TVar12 = (TokenKind)local_e0;
    }
    goto LAB_0032901a;
  }
  local_f8.val = local_f8.val & 0xffffffffffffff00;
  SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
  piVar9 = __errno_location();
  *piVar9 = 0;
  local_d8 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
             strtod(local_c8[0].data_,(char **)&local_f8.pVal);
  if ((pointer)local_f8.val != local_c8[0].data_ + (local_c8[0].len - 1)) {
    assert::assertFailed
              ("end == floatChars.end() - 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Lexer.cpp"
               ,0x3d2,"Token slang::parsing::Lexer::lexNumericLiteral()");
  }
  local_e1 = *piVar9 == 0x22;
  TVar20 = create<double&,bool&,std::optional<slang::TimeUnit>&>
                     (this,TVar12 & EndOfFile | RealLiteral,(double *)&local_d8,&local_e1,
                      (optional<slang::TimeUnit> *)local_e4);
LAB_0032920d:
  if (local_c8[0].data_ != local_c8[0].firstElement) {
    free(local_c8[0].data_);
  }
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    free(local_80[0].data_);
  }
  return TVar20;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        if (peek() == '_')
            addDiag(diag::DigitsLeadingUnderscore, currentOffset());

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any) {
            addDiag(diag::MissingFractionalDigits, currentOffset());
            floatChars.push_back('0');
        }
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        if (c == '_' && hasDecimal)
            addDiag(diag::DigitsLeadingUnderscore, currentOffset());

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any) {
                addDiag(diag::MissingExponentDigits, currentOffset());
                floatChars.push_back('1');
            }
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}